

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc.cpp
# Opt level: O2

void __thiscall Moc::parsePropertyAttributes(Moc *this,PropertyDef *propDef)

{
  QByteArray *lhs;
  QByteArray *lhs_00;
  qsizetype *pqVar1;
  char cVar2;
  Data *pDVar3;
  PropertyDef *pPVar4;
  qsizetype qVar5;
  bool bVar6;
  byte bVar7;
  QTypeRevision QVar8;
  uint uVar9;
  char *pcVar10;
  Symbol *this_00;
  QArrayDataPointer<char> *this_01;
  QByteArray *pQVar11;
  long in_FS_OFFSET;
  undefined1 local_c8 [16];
  bool ok;
  PropertyDef *pPStack_b0;
  char *local_a8;
  QArrayDataPointer<char> local_98;
  QArrayDataPointer<char> local_78;
  QArrayDataPointer<char> local_58;
  anon_class_8_1_8991fb9c local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lhs = &propDef->write;
  lhs_00 = &propDef->read;
  local_40.this = this;
  do {
    this_01 = (QArrayDataPointer<char> *)&ok;
    bVar6 = Parser::test(&this->super_Parser,IDENTIFIER);
    if (!bVar6) {
      bVar7 = propDef->constant;
      if (((bool)bVar7 == true) && ((propDef->write).d.ptr != (char *)0x0)) {
        local_58.size = -0x5555555555555556;
        local_58.d = (Data *)0xaaaaaaaaaaaaaaaa;
        local_58.ptr = (char *)0xaaaaaaaaaaaaaaaa;
        local_78.d = (Data *)0x136983;
        local_78.size = 0x136999;
        local_78.ptr = (char *)propDef;
        QStringBuilder<QStringBuilder<const_char_(&)[22],_QByteArray_&>,_const_char_(&)[59]>::
        convertTo<QByteArray>
                  ((QByteArray *)&local_58,
                   (QStringBuilder<QStringBuilder<const_char_(&)[22],_QByteArray_&>,_const_char_(&)[59]>
                    *)&local_78);
        propDef->constant = false;
        pcVar10 = local_58.ptr;
        if (local_58.ptr == (char *)0x0) {
          pcVar10 = (char *)&QByteArray::_empty;
        }
        Parser::warning(&this->super_Parser,pcVar10);
        QArrayDataPointer<char>::~QArrayDataPointer(&local_58);
        bVar7 = propDef->constant;
      }
      if (((bVar7 & 1) != 0) && ((propDef->notify).d.ptr != (char *)0x0)) {
        local_58.size = -0x5555555555555556;
        local_58.d = (Data *)0xaaaaaaaaaaaaaaaa;
        local_58.ptr = (char *)0xaaaaaaaaaaaaaaaa;
        local_78.d = (Data *)0x136983;
        local_78.size = 0x1369d4;
        local_78.ptr = (char *)propDef;
        QStringBuilder<QStringBuilder<const_char_(&)[22],_QByteArray_&>,_const_char_(&)[60]>::
        convertTo<QByteArray>
                  ((QByteArray *)&local_58,
                   (QStringBuilder<QStringBuilder<const_char_(&)[22],_QByteArray_&>,_const_char_(&)[60]>
                    *)&local_78);
        propDef->constant = false;
        pcVar10 = local_58.ptr;
        if (local_58.ptr == (char *)0x0) {
          pcVar10 = (char *)&QByteArray::_empty;
        }
        Parser::warning(&this->super_Parser,pcVar10);
        QArrayDataPointer<char>::~QArrayDataPointer(&local_58);
        bVar7 = propDef->constant;
      }
      if (((bVar7 & 1) != 0) && ((propDef->bind).d.ptr != (char *)0x0)) {
        local_58.size = -0x5555555555555556;
        local_58.d = (Data *)0xaaaaaaaaaaaaaaaa;
        local_58.ptr = (char *)0xaaaaaaaaaaaaaaaa;
        local_78.d = (Data *)0x136983;
        local_78.size = 0x136a10;
        local_78.ptr = (char *)propDef;
        QStringBuilder<QStringBuilder<const_char_(&)[22],_QByteArray_&>,_const_char_(&)[58]>::
        convertTo<QByteArray>
                  ((QByteArray *)&local_58,
                   (QStringBuilder<QStringBuilder<const_char_(&)[22],_QByteArray_&>,_const_char_(&)[58]>
                    *)&local_78);
        propDef->constant = false;
        pcVar10 = local_58.ptr;
        if (local_58.ptr == (char *)0x0) {
          pcVar10 = (char *)&QByteArray::_empty;
        }
        Parser::warning(&this->super_Parser,pcVar10);
        QArrayDataPointer<char>::~QArrayDataPointer(&local_58);
      }
      local_58.d = (Data *)0x13494a;
      bVar6 = operator==(lhs_00,(char **)&local_58);
      if ((bVar6) && ((propDef->bind).d.ptr == (char *)0x0)) {
        local_58.size = -0x5555555555555556;
        local_58.d = (Data *)0xaaaaaaaaaaaaaaaa;
        local_58.ptr = (char *)0xaaaaaaaaaaaaaaaa;
        local_78.d = (Data *)0x136983;
        local_78.size = 0x136a4a;
        local_78.ptr = (char *)propDef;
        QStringBuilder<QStringBuilder<const_char_(&)[22],_QByteArray_&>,_const_char_(&)[61]>::
        convertTo<QByteArray>
                  ((QByteArray *)&local_58,
                   (QStringBuilder<QStringBuilder<const_char_(&)[22],_QByteArray_&>,_const_char_(&)[61]>
                    *)&local_78);
        QByteArray::operator=(lhs_00,"");
        pcVar10 = local_58.ptr;
        if (local_58.ptr == (char *)0x0) {
          pcVar10 = (char *)&QByteArray::_empty;
        }
        Parser::warning(&this->super_Parser,pcVar10);
        QArrayDataPointer<char>::~QArrayDataPointer(&local_58);
      }
      local_58.d = (Data *)0x13494a;
      bVar6 = operator==(lhs,(char **)&local_58);
      if ((bVar6) && ((propDef->bind).d.ptr == (char *)0x0)) {
        local_58.size = -0x5555555555555556;
        local_58.d = (Data *)0xaaaaaaaaaaaaaaaa;
        local_58.ptr = (char *)0xaaaaaaaaaaaaaaaa;
        local_78.d = (Data *)0x136983;
        local_78.size = 0x136a87;
        local_78.ptr = (char *)propDef;
        QStringBuilder<QStringBuilder<const_char_(&)[22],_QByteArray_&>,_const_char_(&)[63]>::
        convertTo<QByteArray>
                  ((QByteArray *)&local_58,
                   (QStringBuilder<QStringBuilder<const_char_(&)[22],_QByteArray_&>,_const_char_(&)[63]>
                    *)&local_78);
        QByteArray::operator=(lhs,"");
        pcVar10 = local_58.ptr;
        if (local_58.ptr == (char *)0x0) {
          pcVar10 = (char *)&QByteArray::_empty;
        }
        Parser::warning(&this->super_Parser,pcVar10);
        QArrayDataPointer<char>::~QArrayDataPointer(&local_58);
      }
      if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
        __stack_chk_fail();
      }
      return;
    }
    this_00 = (this->super_Parser).symbols.d.ptr + (this->super_Parser).index + -1;
    local_58.size = -0x5555555555555556;
    local_58.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_58.ptr = (char *)0xaaaaaaaaaaaaaaaa;
    Symbol::lexem((QByteArray *)&local_58,this_00);
    if (*local_58.ptr == 'C') {
      local_78.d = (Data *)0x136919;
      bVar6 = operator==((QByteArray *)&local_58,(char **)&local_78);
      if (!bVar6) goto LAB_0011a67b;
      propDef->constant = true;
      goto LAB_0011adb7;
    }
LAB_0011a67b:
    if (*local_58.ptr == 'F') {
      local_78.d = (Data *)0x135bb8;
      bVar6 = operator==((QByteArray *)&local_58,(char **)&local_78);
      if (bVar6) {
        propDef->final = true;
        goto LAB_0011adb7;
      }
    }
    if (*local_58.ptr == 'N') {
      local_78.d = (Data *)0x136922;
      bVar6 = operator==((QByteArray *)&local_58,(char **)&local_78);
      if (!bVar6) goto LAB_0011a730;
      Parser::next(&this->super_Parser,IDENTIFIER);
      Parser::lexem((QByteArray *)&local_78,&this->super_Parser);
      pDVar3 = (propDef->name).d.d;
      pPVar4 = (PropertyDef *)(propDef->name).d.ptr;
      (propDef->name).d.d = local_78.d;
      (propDef->name).d.ptr = local_78.ptr;
      pcVar10 = (char *)(propDef->name).d.size;
      (propDef->name).d.size = local_78.size;
      local_78.d = pDVar3;
      local_78.ptr = (char *)pPVar4;
      local_78.size = (qsizetype)pcVar10;
      goto LAB_0011adaf;
    }
LAB_0011a730:
    if (*local_58.ptr == 'R') {
      local_78.d = (Data *)0x136927;
      bVar6 = operator==((QByteArray *)&local_58,(char **)&local_78);
      if (bVar6) {
        propDef->required = true;
        goto LAB_0011adb7;
      }
    }
    if (*local_58.ptr == 'R') {
      local_78.d = (Data *)0x136930;
      bVar6 = operator==((QByteArray *)&local_58,(char **)&local_78);
      if ((bVar6) && (bVar6 = Parser::test(&this->super_Parser,LPAREN), bVar6)) {
        pqVar1 = &(this->super_Parser).index;
        *pqVar1 = *pqVar1 + -1;
        QVar8 = parseRevision(this);
        propDef->revision = (uint)(ushort)QVar8;
        goto LAB_0011adb7;
      }
    }
    local_78.d = (Data *)0x0;
    local_78.ptr = (char *)0x0;
    local_78.size = 0;
    local_98.d = (Data *)0x0;
    local_98.ptr = (char *)0x0;
    local_98.size = 0;
    bVar6 = Parser::test(&this->super_Parser,LPAREN);
    if (bVar6) {
      lexemUntil((QByteArray *)this_01,this,PP_RPAREN);
      qVar5 = local_78.size;
      pcVar10 = local_78.ptr;
      pDVar3 = local_78.d;
      local_78.d = (Data *)_ok;
      local_78.ptr = (char *)pPStack_b0;
      _ok = (char *)pDVar3;
      pPStack_b0 = (PropertyDef *)pcVar10;
      local_78.size = (qsizetype)local_a8;
      local_a8 = (char *)qVar5;
      QArrayDataPointer<char>::~QArrayDataPointer(this_01);
      QByteArray::mid((longlong)this_01,(longlong)&local_78);
      qVar5 = local_78.size;
      pcVar10 = local_78.ptr;
      pDVar3 = local_78.d;
      local_78.d = (Data *)_ok;
      local_78.ptr = (char *)pPStack_b0;
      _ok = (char *)pDVar3;
      pPStack_b0 = (PropertyDef *)pcVar10;
      local_78.size = (qsizetype)local_a8;
      local_a8 = (char *)qVar5;
LAB_0011a891:
      QArrayDataPointer<char>::~QArrayDataPointer(this_01);
    }
    else {
      bVar6 = Parser::test(&this->super_Parser,INTEGER_LITERAL);
      if (bVar6) {
        Parser::lexem((QByteArray *)this_01,&this->super_Parser);
        qVar5 = local_78.size;
        pcVar10 = local_78.ptr;
        pDVar3 = local_78.d;
        local_78.d = (Data *)_ok;
        local_78.ptr = (char *)pPStack_b0;
        _ok = (char *)pDVar3;
        pPStack_b0 = (PropertyDef *)pcVar10;
        local_78.size = (qsizetype)local_a8;
        local_a8 = (char *)qVar5;
        QArrayDataPointer<char>::~QArrayDataPointer(this_01);
        _ok = "REVISION";
LAB_0011a92d:
        bVar6 = operator!=((QByteArray *)&local_58,(char **)this_01);
        if (bVar6) goto switchD_0011a974_caseD_4f;
      }
      else {
        bVar6 = Parser::test(&this->super_Parser,DEFAULT);
        if (bVar6) {
          Parser::lexem((QByteArray *)this_01,&this->super_Parser);
          qVar5 = local_78.size;
          pcVar10 = local_78.ptr;
          pDVar3 = local_78.d;
          local_78.d = (Data *)_ok;
          local_78.ptr = (char *)pPStack_b0;
          _ok = (char *)pDVar3;
          pPStack_b0 = (PropertyDef *)pcVar10;
          local_78.size = (qsizetype)local_a8;
          local_a8 = (char *)qVar5;
          QArrayDataPointer<char>::~QArrayDataPointer(this_01);
          _ok = "READ";
          bVar6 = operator!=((QByteArray *)&local_58,(char **)this_01);
          if (bVar6) {
            local_c8._0_8_ = "WRITE";
            this_01 = (QArrayDataPointer<char> *)local_c8;
            goto LAB_0011a92d;
          }
        }
        else {
          Parser::next(&this->super_Parser,IDENTIFIER);
          Parser::lexem((QByteArray *)this_01,&this->super_Parser);
          qVar5 = local_78.size;
          pcVar10 = local_78.ptr;
          pDVar3 = local_78.d;
          local_78.d = (Data *)_ok;
          local_78.ptr = (char *)pPStack_b0;
          _ok = (char *)pDVar3;
          pPStack_b0 = (PropertyDef *)pcVar10;
          local_78.size = (qsizetype)local_a8;
          local_a8 = (char *)qVar5;
          QArrayDataPointer<char>::~QArrayDataPointer(this_01);
          bVar6 = Parser::test(&this->super_Parser,LPAREN);
          if (bVar6) {
            lexemUntil((QByteArray *)this_01,this,PP_RPAREN);
            pDVar3 = (Data *)_ok;
            pPVar4 = pPStack_b0;
            _ok = (char *)local_98.d;
            pPStack_b0 = (PropertyDef *)local_98.ptr;
            pcVar10 = local_a8;
            local_a8 = (char *)local_98.size;
            local_98.d = pDVar3;
            local_98.ptr = (char *)pPVar4;
            local_98.size = (qsizetype)pcVar10;
            goto LAB_0011a891;
          }
          _ok = "true";
          bVar6 = operator!=((QByteArray *)&local_78,(char **)this_01);
          if (bVar6) {
            local_c8._0_8_ = "false";
            bVar6 = operator!=((QByteArray *)&local_78,(char **)local_c8);
            if (bVar6) {
              QByteArray::operator=((QByteArray *)&local_98,"()");
            }
          }
        }
      }
    }
    cVar2 = *local_58.ptr;
    switch(cVar2) {
    case 'M':
      _ok = "MEMBER";
      bVar6 = operator==((QByteArray *)&local_58,(char **)&ok);
      pQVar11 = &propDef->member;
      if (!bVar6) goto switchD_0011a974_caseD_4f;
      break;
    case 'N':
      _ok = "NOTIFY";
      bVar6 = operator!=((QByteArray *)&local_58,(char **)&ok);
      pQVar11 = &propDef->notify;
      if (bVar6) goto switchD_0011a974_caseD_4f;
      break;
    case 'O':
    case 'P':
    case 'Q':
    case 'T':
    case 'V':
switchD_0011a974_caseD_4f:
      Parser::error(&this->super_Parser,this_00);
    case 'R':
      _ok = "READ";
      bVar6 = operator==((QByteArray *)&local_58,(char **)&ok);
      pQVar11 = lhs_00;
      if (!bVar6) {
        _ok = "RESET";
        bVar6 = operator==((QByteArray *)&local_58,(char **)&ok);
        pQVar11 = &propDef->reset;
        if (!bVar6) {
          _ok = "REVISION";
          bVar6 = operator==((QByteArray *)&local_58,(char **)&ok);
          if (!bVar6) goto switchD_0011a974_caseD_4f;
          _ok = (char *)((ulong)_ok & 0xffffffffffffff00);
          uVar9 = QByteArray::toInt((bool *)&local_78,(int)&ok);
          if ((0xfe < uVar9) || (ok == false)) goto switchD_0011a974_caseD_4f;
          propDef->revision = uVar9 | 0xff00;
          goto LAB_0011adaa;
        }
      }
      break;
    case 'S':
      _ok = "SCRIPTABLE";
      bVar6 = operator==((QByteArray *)&local_58,(char **)&ok);
      if (!bVar6) {
        _ok = "STORED";
        bVar6 = operator==((QByteArray *)&local_58,(char **)&ok);
        if (!bVar6) goto switchD_0011a974_caseD_4f;
        local_c8._8_8_ = &local_98;
        local_c8._0_8_ = &local_78;
        QStringBuilder<QByteArray_&,_QByteArray_&>::convertTo<QByteArray>
                  ((QByteArray *)&ok,(QStringBuilder<QByteArray_&,_QByteArray_&> *)local_c8);
        pDVar3 = (propDef->stored).d.d;
        pPVar4 = (PropertyDef *)(propDef->stored).d.ptr;
        (propDef->stored).d.d = (Data *)_ok;
        (propDef->stored).d.ptr = (char *)pPStack_b0;
        pcVar10 = (char *)(propDef->stored).d.size;
        (propDef->stored).d.size = (qsizetype)local_a8;
        _ok = (char *)pDVar3;
        pPStack_b0 = pPVar4;
        local_a8 = pcVar10;
        QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&ok);
        pcVar10 = "STORED";
        pQVar11 = &propDef->stored;
        goto LAB_0011aed6;
      }
      local_c8._0_8_ = &local_78;
      local_c8._8_8_ = &local_98;
      QStringBuilder<QByteArray_&,_QByteArray_&>::convertTo<QByteArray>
                ((QByteArray *)&ok,(QStringBuilder<QByteArray_&,_QByteArray_&> *)local_c8);
      pDVar3 = (propDef->scriptable).d.d;
      pPVar4 = (PropertyDef *)(propDef->scriptable).d.ptr;
      (propDef->scriptable).d.d = (Data *)_ok;
      (propDef->scriptable).d.ptr = (char *)pPStack_b0;
      pcVar10 = (char *)(propDef->scriptable).d.size;
      (propDef->scriptable).d.size = (qsizetype)local_a8;
      _ok = (char *)pDVar3;
      pPStack_b0 = pPVar4;
      local_a8 = pcVar10;
      QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&ok);
      pcVar10 = "SCRIPTABLE";
      pQVar11 = &propDef->scriptable;
LAB_0011ad37:
      parsePropertyAttributes::anon_class_8_1_8991fb9c::operator()(&local_40,pQVar11,pcVar10);
      goto LAB_0011adaa;
    case 'U':
      _ok = "USER";
      bVar6 = operator!=((QByteArray *)&local_58,(char **)&ok);
      if (bVar6) goto switchD_0011a974_caseD_4f;
      local_c8._0_8_ = &local_78;
      local_c8._8_8_ = &local_98;
      QStringBuilder<QByteArray_&,_QByteArray_&>::convertTo<QByteArray>
                ((QByteArray *)&ok,(QStringBuilder<QByteArray_&,_QByteArray_&> *)local_c8);
      pDVar3 = (propDef->user).d.d;
      pPVar4 = (PropertyDef *)(propDef->user).d.ptr;
      (propDef->user).d.d = (Data *)_ok;
      (propDef->user).d.ptr = (char *)pPStack_b0;
      pcVar10 = (char *)(propDef->user).d.size;
      (propDef->user).d.size = (qsizetype)local_a8;
      _ok = (char *)pDVar3;
      pPStack_b0 = pPVar4;
      local_a8 = pcVar10;
      QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&ok);
      pcVar10 = "USER";
      pQVar11 = &propDef->user;
LAB_0011aed6:
      parsePropertyAttributes::anon_class_8_1_8991fb9c::operator()(&local_40,pQVar11,pcVar10);
      goto LAB_0011adaa;
    case 'W':
      _ok = "WRITE";
      bVar6 = operator!=((QByteArray *)&local_58,(char **)&ok);
      pQVar11 = lhs;
      if (bVar6) goto switchD_0011a974_caseD_4f;
      break;
    default:
      if (cVar2 != 'B') {
        if (cVar2 != 'D') goto switchD_0011a974_caseD_4f;
        _ok = "DESIGNABLE";
        bVar6 = operator!=((QByteArray *)&local_58,(char **)&ok);
        if (bVar6) goto switchD_0011a974_caseD_4f;
        local_c8._0_8_ = &local_78;
        local_c8._8_8_ = &local_98;
        QStringBuilder<QByteArray_&,_QByteArray_&>::convertTo<QByteArray>
                  ((QByteArray *)&ok,(QStringBuilder<QByteArray_&,_QByteArray_&> *)local_c8);
        pDVar3 = (propDef->designable).d.d;
        pPVar4 = (PropertyDef *)(propDef->designable).d.ptr;
        (propDef->designable).d.d = (Data *)_ok;
        (propDef->designable).d.ptr = (char *)pPStack_b0;
        pcVar10 = (char *)(propDef->designable).d.size;
        (propDef->designable).d.size = (qsizetype)local_a8;
        _ok = (char *)pDVar3;
        pPStack_b0 = pPVar4;
        local_a8 = pcVar10;
        QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&ok);
        pcVar10 = "DESIGNABLE";
        pQVar11 = &propDef->designable;
        goto LAB_0011ad37;
      }
      _ok = "BINDABLE";
      bVar6 = operator!=((QByteArray *)&local_58,(char **)&ok);
      pQVar11 = &propDef->bind;
      if (bVar6) goto switchD_0011a974_caseD_4f;
    }
    QByteArray::operator=(pQVar11,(QByteArray *)&local_78);
LAB_0011adaa:
    QArrayDataPointer<char>::~QArrayDataPointer(&local_98);
LAB_0011adaf:
    QArrayDataPointer<char>::~QArrayDataPointer(&local_78);
LAB_0011adb7:
    QArrayDataPointer<char>::~QArrayDataPointer(&local_58);
  } while( true );
}

Assistant:

void Moc::parsePropertyAttributes(PropertyDef &propDef)
{
    auto checkIsFunction = [&](const QByteArray &def, const char *name) {
        if (def.endsWith(')')) {
            QByteArray msg = "Providing a function for ";
            msg += name;
            msg += " in a property declaration is not be supported in Qt 6.";
            error(msg.constData());
        }
    };

    while (test(IDENTIFIER)) {
        const Symbol &lsym = symbol();
        const QByteArray l = lsym.lexem();
        if (l[0] == 'C' && l == "CONSTANT") {
            propDef.constant = true;
            continue;
        } else if (l[0] == 'F' && l == "FINAL") {
            propDef.final = true;
            continue;
        } else if (l[0] == 'N' && l == "NAME") {
            next(IDENTIFIER);
            propDef.name = lexem();
            continue;
        } else if (l[0] == 'R' && l == "REQUIRED") {
            propDef.required = true;
            continue;
        } else if (l[0] == 'R' && l == "REVISION" && test(LPAREN)) {
            prev();
            propDef.revision = parseRevision().toEncodedVersion<int>();
            continue;
        }

        QByteArray v, v2;
        if (test(LPAREN)) {
            v = lexemUntil(RPAREN);
            v = v.mid(1, v.size() - 2); // removes the '(' and ')'
        } else if (test(INTEGER_LITERAL)) {
            v = lexem();
            if (l != "REVISION")
                error(lsym);
        } else if (test(DEFAULT)) {
            v = lexem();
            if (l != "READ" && l != "WRITE")
                error(lsym);
        } else {
            next(IDENTIFIER);
            v = lexem();
            if (test(LPAREN))
                v2 = lexemUntil(RPAREN);
            else if (v != "true" && v != "false")
                v2 = "()";
        }
        switch (l[0]) {
        case 'M':
            if (l == "MEMBER")
                propDef.member = v;
            else
                error(lsym);
            break;
        case 'R':
            if (l == "READ")
                propDef.read = v;
            else if (l == "RESET")
                propDef.reset = v;
            else if (l == "REVISION") {
                bool ok = false;
                const int minor = v.toInt(&ok);
                if (!ok || !QTypeRevision::isValidSegment(minor))
                    error(lsym);
                propDef.revision = QTypeRevision::fromMinorVersion(minor).toEncodedVersion<int>();
            } else
                error(lsym);
            break;
        case 'S':
            if (l == "SCRIPTABLE") {
                propDef.scriptable = v + v2;
                checkIsFunction(propDef.scriptable, "SCRIPTABLE");
            } else if (l == "STORED") {
                propDef.stored = v + v2;
                checkIsFunction(propDef.stored, "STORED");
            } else
                error(lsym);
            break;
        case 'W': if (l != "WRITE") error(lsym);
            propDef.write = v;
            break;
        case 'B': if (l != "BINDABLE") error(lsym);
            propDef.bind = v;
            break;
        case 'D': if (l != "DESIGNABLE") error(lsym);
            propDef.designable = v + v2;
            checkIsFunction(propDef.designable, "DESIGNABLE");
            break;
        case 'N': if (l != "NOTIFY") error(lsym);
            propDef.notify = v;
            break;
        case 'U': if (l != "USER") error(lsym);
            propDef.user = v + v2;
            checkIsFunction(propDef.user, "USER");
            break;
        default:
            error(lsym);
        }
    }
    if (propDef.constant && !propDef.write.isNull()) {
        const QByteArray msg = "Property declaration " + propDef.name
                + " is both WRITEable and CONSTANT. CONSTANT will be ignored.";
        propDef.constant = false;
        warning(msg.constData());
    }
    if (propDef.constant && !propDef.notify.isNull()) {
        const QByteArray msg = "Property declaration " + propDef.name
                + " is both NOTIFYable and CONSTANT. CONSTANT will be ignored.";
        propDef.constant = false;
        warning(msg.constData());
    }
    if (propDef.constant && !propDef.bind.isNull()) {
        const QByteArray msg = "Property declaration " + propDef.name
                + " is both BINDable and CONSTANT. CONSTANT will be ignored.";
        propDef.constant = false;
        warning(msg.constData());
    }
    if (propDef.read == "default" && propDef.bind.isNull()) {
        const QByteArray msg = "Property declaration " + propDef.name
                + " is not BINDable but default-READable. READ will be ignored.";
        propDef.read = "";
        warning(msg.constData());
    }
    if (propDef.write == "default" && propDef.bind.isNull()) {
        const QByteArray msg = "Property declaration " + propDef.name
                + " is not BINDable but default-WRITEable. WRITE will be ignored.";
        propDef.write = "";
        warning(msg.constData());
    }
}